

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O2

ZeroCopyOutputStream * __thiscall
google::protobuf::compiler::GeneratorResponseContext::Open
          (GeneratorResponseContext *this,string *filename)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>_>
  *this_00;
  StringOutputStream *this_01;
  string *target;
  Arena *arena;
  
  this_00 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
                      (&(this->response_->field_0)._impl_.file_.super_RepeatedPtrFieldBase);
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 1;
  arena = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(this_00->field_0)._impl_.name_,filename,arena);
  this_01 = (StringOutputStream *)operator_new(0x10);
  target = CodeGeneratorResponse_File::_internal_mutable_content_abi_cxx11_(this_00);
  io::StringOutputStream::StringOutputStream(this_01,target);
  return &this_01->super_ZeroCopyOutputStream;
}

Assistant:

io::ZeroCopyOutputStream* Open(const std::string& filename) override {
    CodeGeneratorResponse::File* file = response_->add_file();
    file->set_name(filename);
    return new io::StringOutputStream(file->mutable_content());
  }